

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag>::
show_population(storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag> *this,
               context *ctx)

{
  int iVar1;
  pointer piVar2;
  pointer prVar3;
  long lVar4;
  ulong uVar5;
  unsigned_long local_30;
  
  local_30 = (long)(this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
  info<unsigned_long>(ctx," Population {}:\n",&local_30);
  if (this->m_size != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      piVar2 = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      prVar3 = (this->m_data).
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar1 = *(int *)((long)piVar2 + lVar4);
      info<int,double,int,unsigned_long>
                (ctx,"  - {}: value {} constraints {} hash {}\n",(int *)((long)piVar2 + lVar4),
                 &prVar3[iVar1].value,&prVar3[iVar1].remaining_constraints,&prVar3[iVar1].hash);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 4;
    } while (uVar5 != (uint)this->m_size);
  }
  return;
}

Assistant:

void show_population(const context& ctx) const
    {
        info(ctx, " Population {}:\n", m_indices.size());
        for (int i = 0; i != m_size; ++i)
            info(ctx,
                 "  - {}: value {} constraints {} hash {}\n",
                 m_indices[i],
                 m_data[m_indices[i]].value,
                 m_data[m_indices[i]].remaining_constraints,
                 m_data[m_indices[i]].hash);
    }